

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O0

void __thiscall
draco::EncoderOptionsBase<int>::SetSpeed
          (EncoderOptionsBase<int> *this,int encoding_speed,int decoding_speed)

{
  DracoOptions<int> *in_RDI;
  string *in_stack_ffffffffffffff78;
  string *name;
  allocator<char> local_69;
  string local_68 [24];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  DracoOptions<int>::SetGlobalInt(in_RDI,in_stack_ffffffffffffff78,0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  name = (string *)&local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  DracoOptions<int>::SetGlobalInt(in_RDI,name,0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void SetSpeed(int encoding_speed, int decoding_speed) {
    this->SetGlobalInt("encoding_speed", encoding_speed);
    this->SetGlobalInt("decoding_speed", decoding_speed);
  }